

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_columnrowcolumn(void)

{
  int iVar1;
  undefined1 local_70 [8];
  matrix2 m;
  matrix2 r;
  matrix2 c;
  
  matrix2_zero((matrix2 *)((long)&r.field_0 + 0x18));
  matrix2_zero((matrix2 *)((long)&m.field_0 + 0x18));
  matrix2_zero((matrix2 *)local_70);
  _matrix2_set_random((matrix2 *)local_70);
  matrix2_set((matrix2 *)((long)&r.field_0 + 0x18),(matrix2 *)local_70);
  matrix2_set((matrix2 *)((long)&m.field_0 + 0x18),(matrix2 *)local_70);
  iVar1 = matrix2_equals((matrix2 *)((long)&r.field_0 + 0x18),(matrix2 *)((long)&m.field_0 + 0x18));
  if (iVar1 == 0) {
    c.field_0.m[3] = (double)anon_var_dwarf_432;
  }
  else {
    iVar1 = matrix2_equals((matrix2 *)((long)&r.field_0 + 0x18),(matrix2 *)local_70);
    if (iVar1 == 0) {
      c.field_0.m[3] = (double)anon_var_dwarf_448;
    }
    else {
      iVar1 = matrix2_equals((matrix2 *)local_70,(matrix2 *)((long)&m.field_0 + 0x18));
      if (iVar1 == 0) {
        c.field_0.m[3] = (double)anon_var_dwarf_452;
      }
      else {
        _matrix2_transpose_rowcolumn((matrix2 *)((long)&m.field_0 + 0x18));
        _matrix2_transpose_columnrow((matrix2 *)((long)&r.field_0 + 0x18));
        iVar1 = matrix2_equals((matrix2 *)((long)&r.field_0 + 0x18),
                               (matrix2 *)((long)&m.field_0 + 0x18));
        if (iVar1 == 0) {
          c.field_0.m[3] = (double)anon_var_dwarf_45c;
        }
        else {
          iVar1 = matrix2_equals((matrix2 *)((long)&r.field_0 + 0x18),(matrix2 *)local_70);
          if (iVar1 == 0) {
            iVar1 = matrix2_equals((matrix2 *)local_70,(matrix2 *)((long)&m.field_0 + 0x18));
            if (iVar1 == 0) {
              matrix2_transpose((matrix2 *)local_70);
              iVar1 = matrix2_equals((matrix2 *)((long)&r.field_0 + 0x18),(matrix2 *)local_70);
              if (iVar1 == 0) {
                c.field_0.m[3] = (double)anon_var_dwarf_47a;
              }
              else {
                iVar1 = matrix2_equals((matrix2 *)local_70,(matrix2 *)((long)&m.field_0 + 0x18));
                if (iVar1 == 0) {
                  c.field_0.m[3] = (double)anon_var_dwarf_484;
                }
                else {
                  c.field_0.m[3] = 0.0;
                }
              }
            }
            else {
              c.field_0.m[3] = (double)anon_var_dwarf_470;
            }
          }
          else {
            c.field_0.m[3] = (double)anon_var_dwarf_466;
          }
        }
      }
    }
  }
  return (char *)c.field_0.m[3];
}

Assistant:

static char *test_matrix2_columnrowcolumn(void)
{
	struct matrix2 c;
	struct matrix2 r;
	struct matrix2 m;

	matrix2_zero(&c);
	matrix2_zero(&r);
	matrix2_zero(&m);

	_matrix2_set_random(&m);

	matrix2_set(&c, &m);
	matrix2_set(&r, &m);

	test_assert(matrix2_equals(&c, &r));
	test_assert(matrix2_equals(&c, &m));
	test_assert(matrix2_equals(&m, &r));

	/* transpose only c and r, but not m */
	_matrix2_transpose_rowcolumn(&r);
	_matrix2_transpose_columnrow(&c);

	test_assert(matrix2_equals(&c, &r));
	test_assert(matrix2_equals(&c, &m) == 0);
	test_assert(matrix2_equals(&m, &r) == 0);

	matrix2_transpose(&m);

	test_assert(matrix2_equals(&c, &m));
	test_assert(matrix2_equals(&m, &r));

	return NULL;
}